

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextobject.cpp
# Opt level: O0

iterator * __thiscall QTextBlock::iterator::operator--(iterator *this)

{
  int iVar1;
  uint uVar2;
  QTextFragmentData *pQVar3;
  iterator *in_RDI;
  int last;
  int formatIndex;
  uint in_stack_ffffffffffffffdc;
  int local_18;
  iterator *local_8;
  
  QTextDocumentPrivate::fragmentMap(in_RDI->p);
  uVar2 = QFragmentMap<QTextFragmentData>::previous
                    ((QFragmentMap<QTextFragmentData> *)in_RDI,in_stack_ffffffffffffffdc);
  in_RDI->n = uVar2;
  local_8 = in_RDI;
  if (in_RDI->n != in_RDI->b) {
    QTextDocumentPrivate::fragmentMap(in_RDI->p);
    pQVar3 = QFragmentMap<QTextFragmentData>::fragment
                       ((QFragmentMap<QTextFragmentData> *)in_RDI,in_stack_ffffffffffffffdc);
    iVar1 = pQVar3->format;
    local_18 = in_RDI->n;
    while( true ) {
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc & 0xffffff;
      if (in_RDI->n != in_RDI->b) {
        QTextDocumentPrivate::fragmentMap(in_RDI->p);
        pQVar3 = QFragmentMap<QTextFragmentData>::fragment
                           ((QFragmentMap<QTextFragmentData> *)in_RDI,in_stack_ffffffffffffffdc);
        in_stack_ffffffffffffffdc =
             CONCAT13(pQVar3->format != iVar1,(int3)in_stack_ffffffffffffffdc);
      }
      if ((char)(in_stack_ffffffffffffffdc >> 0x18) == '\0') break;
      local_18 = in_RDI->n;
      QTextDocumentPrivate::fragmentMap(in_RDI->p);
      uVar2 = QFragmentMap<QTextFragmentData>::previous
                        ((QFragmentMap<QTextFragmentData> *)in_RDI,in_stack_ffffffffffffffdc);
      in_RDI->n = uVar2;
    }
    in_RDI->n = local_18;
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

QTextBlock::iterator &QTextBlock::iterator::operator--()
{
    n = p->fragmentMap().previous(n);

    if (n == b)
        return *this;

    int formatIndex = p->fragmentMap().fragment(n)->format;
    int last = n;

    while (n != b && p->fragmentMap().fragment(n)->format != formatIndex) {
        last = n;
        n = p->fragmentMap().previous(n);
    }

    n = last;
    return *this;
}